

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

SessionID * __thiscall
FIX::Message::getSessionID(SessionID *__return_storage_ptr__,Message *this,string *qualifier)

{
  FieldMap *pFVar1;
  StringField *pSVar2;
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  string *qualifier_local;
  Message *this_local;
  
  pFVar1 = &getHeader(this)->super_FieldMap;
  pSVar2 = &FieldMap::getField<FIX::BeginString>(pFVar1)->super_StringField;
  beginString = StringField::operator_cast_to_string_(pSVar2);
  pFVar1 = &getHeader(this)->super_FieldMap;
  pSVar2 = &FieldMap::getField<FIX::SenderCompID>(pFVar1)->super_StringField;
  senderCompID = StringField::operator_cast_to_string_(pSVar2);
  pFVar1 = &getHeader(this)->super_FieldMap;
  pSVar2 = &FieldMap::getField<FIX::TargetCompID>(pFVar1)->super_StringField;
  targetCompID = StringField::operator_cast_to_string_(pSVar2);
  SessionID::SessionID(__return_storage_ptr__,beginString,senderCompID,targetCompID,qualifier);
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(FieldNotFound) {
  return SessionID(
      getHeader().getField<BeginString>(),
      getHeader().getField<SenderCompID>(),
      getHeader().getField<TargetCompID>(),
      qualifier);
}